

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void ARGBAttenuateRow_C(uint8_t *src_argb,uint8_t *dst_argb,int width)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  int iVar4;
  uint uVar5;
  
  if (1 < width) {
    iVar4 = 0;
    do {
      uVar1 = src_argb[1];
      uVar2 = src_argb[2];
      uVar3 = src_argb[3];
      uVar5 = (uint)CONCAT11(uVar3,uVar3);
      *dst_argb = (uint8_t)(CONCAT11(*src_argb,*src_argb) * uVar5 >> 0x18);
      dst_argb[1] = (uint8_t)(CONCAT11(uVar1,uVar1) * uVar5 >> 0x18);
      dst_argb[2] = (uint8_t)(CONCAT11(uVar2,uVar2) * uVar5 >> 0x18);
      dst_argb[3] = uVar3;
      uVar1 = src_argb[5];
      uVar2 = src_argb[6];
      uVar3 = src_argb[7];
      uVar5 = (uint)CONCAT11(uVar3,uVar3);
      dst_argb[4] = (uint8_t)(CONCAT11(src_argb[4],src_argb[4]) * uVar5 >> 0x18);
      dst_argb[5] = (uint8_t)(CONCAT11(uVar1,uVar1) * uVar5 >> 0x18);
      dst_argb[6] = (uint8_t)(CONCAT11(uVar2,uVar2) * uVar5 >> 0x18);
      dst_argb[7] = uVar3;
      src_argb = src_argb + 8;
      dst_argb = dst_argb + 8;
      iVar4 = iVar4 + 2;
    } while (iVar4 < width + -1);
  }
  if ((width & 1U) != 0) {
    uVar1 = src_argb[1];
    uVar2 = src_argb[2];
    uVar3 = src_argb[3];
    uVar5 = (uint)CONCAT11(uVar3,uVar3);
    *dst_argb = (uint8_t)(CONCAT11(*src_argb,*src_argb) * uVar5 >> 0x18);
    dst_argb[1] = (uint8_t)(CONCAT11(uVar1,uVar1) * uVar5 >> 0x18);
    dst_argb[2] = (uint8_t)(CONCAT11(uVar2,uVar2) * uVar5 >> 0x18);
    dst_argb[3] = uVar3;
  }
  return;
}

Assistant:

void ARGBAttenuateRow_C(const uint8_t* src_argb, uint8_t* dst_argb, int width) {
  int i;
  for (i = 0; i < width - 1; i += 2) {
    uint32_t b = src_argb[0];
    uint32_t g = src_argb[1];
    uint32_t r = src_argb[2];
    uint32_t a = src_argb[3];
    dst_argb[0] = ATTENUATE(b, a);
    dst_argb[1] = ATTENUATE(g, a);
    dst_argb[2] = ATTENUATE(r, a);
    dst_argb[3] = a;
    b = src_argb[4];
    g = src_argb[5];
    r = src_argb[6];
    a = src_argb[7];
    dst_argb[4] = ATTENUATE(b, a);
    dst_argb[5] = ATTENUATE(g, a);
    dst_argb[6] = ATTENUATE(r, a);
    dst_argb[7] = a;
    src_argb += 8;
    dst_argb += 8;
  }

  if (width & 1) {
    const uint32_t b = src_argb[0];
    const uint32_t g = src_argb[1];
    const uint32_t r = src_argb[2];
    const uint32_t a = src_argb[3];
    dst_argb[0] = ATTENUATE(b, a);
    dst_argb[1] = ATTENUATE(g, a);
    dst_argb[2] = ATTENUATE(r, a);
    dst_argb[3] = a;
  }
}